

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_val_t * mpcaf_grammar_char(mpc_val_t *x,void *s)

{
  byte bVar1;
  char *__ptr;
  mpc_parser_t *pmVar2;
  
  __ptr = (char *)mpcf_unescape(x);
  bVar1 = *(byte *)((long)s + 0x18);
  pmVar2 = mpc_char(*__ptr);
  if ((bVar1 & 2) == 0) {
    pmVar2 = mpc_tok(pmVar2);
  }
  free(__ptr);
  pmVar2 = mpc_apply(pmVar2,mpcf_str_ast);
  pmVar2 = mpca_tag(pmVar2,"char");
  pmVar2 = mpca_state(pmVar2);
  return pmVar2;
}

Assistant:

static mpc_val_t *mpcaf_grammar_char(mpc_val_t *x, void *s) {
  mpca_grammar_st_t *st = s;
  char *y = mpcf_unescape(x);
  mpc_parser_t *p = (st->flags & MPCA_LANG_WHITESPACE_SENSITIVE) ? mpc_char(y[0]) : mpc_tok(mpc_char(y[0]));
  free(y);
  return mpca_state(mpca_tag(mpc_apply(p, mpcf_str_ast), "char"));
}